

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O1

bool duckdb::LikeOperatorFunction(string_t *s,string_t *pat,char escape)

{
  bool bVar1;
  ulong plen;
  ulong slen;
  char *sdata;
  
  slen = (ulong)(s->value).pointer.length;
  if (slen < 0xd) {
    sdata = (s->value).pointer.prefix;
  }
  else {
    sdata = (s->value).pointer.ptr;
  }
  plen = (ulong)(pat->value).pointer.length;
  if (0xc < plen) {
    bVar1 = TemplatedLikeOperator<(char)37,(char)95,true,duckdb::StandardCharacterReader>
                      (sdata,slen,(pat->value).pointer.ptr,plen,escape);
    return bVar1;
  }
  bVar1 = TemplatedLikeOperator<(char)37,(char)95,true,duckdb::StandardCharacterReader>
                    (sdata,slen,(pat->value).pointer.prefix,plen,escape);
  return bVar1;
}

Assistant:

bool LikeOperatorFunction(string_t &s, string_t &pat, char escape) {
	return LikeOperatorFunction(s.GetData(), s.GetSize(), pat.GetData(), pat.GetSize(), escape);
}